

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ResultBuilder * __thiscall
Catch::ExpressionLhs<unsigned_char_const&>::captureExpression<(Catch::Internal::Operator)1,int>
          (ExpressionLhs<unsigned_char_const&> *this,int *rhs)

{
  ResultBuilder *pRVar1;
  ulong uVar2;
  OfType OVar3;
  int value;
  string local_78 [7];
  undefined1 local_68 [16];
  string local_58;
  undefined1 *local_38;
  undefined1 local_28 [16];
  
  OVar3 = ExpressionFailed;
  if (*rhs != (uint)**(byte **)(this + 8)) {
    OVar3 = Ok;
  }
  pRVar1 = *(ResultBuilder **)this;
  (pRVar1->m_data).resultType = OVar3;
  uVar2 = (ulong)_local_78 >> 0x38;
  Catch::toString_abi_cxx11_((char)uVar2);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).lhs);
  Catch::toString_abi_cxx11_(&local_58,(Catch *)(ulong)(uint)*rhs,value);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).rhs);
  _local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>(local_78,"!=","");
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).op);
  if (_local_78 != local_68) {
    operator_delete(_local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }